

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_run(uv_loop_t *loop,uv_run_mode mode)

{
  uint *puVar1;
  uv_handle_type uVar2;
  long ****pppplVar3;
  long ***ppplVar4;
  uv_stream_t *puVar5;
  uv_stream_t *stream;
  int timeout;
  uint uVar6;
  uint64_t uVar7;
  void **ppvVar8;
  QUEUE *q;
  long ***local_58;
  long *local_50;
  void **local_40;
  void **local_38;
  
  if (((loop->active_handles == 0) && (loop->active_reqs == (void **)loop->active_reqs[0])) &&
     (loop->closing_handles == (uv_handle_t *)0x0)) {
    uVar7 = uv__hrtime(UV_CLOCK_FAST);
    loop->time = uVar7 / 1000000;
    uVar6 = 0;
  }
  else {
    ppvVar8 = loop->pending_queue;
    local_40 = loop->active_reqs;
    local_38 = ppvVar8;
    while (loop->stop_flag == 0) {
      uVar7 = uv__hrtime(UV_CLOCK_FAST);
      loop->time = uVar7 / 1000000;
      uv__run_timers(loop);
      pppplVar3 = (long ****)loop->pending_queue[0];
      if ((long ****)ppvVar8 != pppplVar3) {
        local_50 = (long *)loop->pending_queue[1];
        *local_50 = (long)&local_58;
        ppplVar4 = pppplVar3[1];
        loop->pending_queue[1] = ppplVar4;
        *ppplVar4 = (long **)ppvVar8;
        pppplVar3[1] = (long ***)&local_58;
        local_58 = (long ***)pppplVar3;
        while (&local_58 != (long ****)local_58) {
          *local_58[1] = (long *)*local_58;
          (*local_58)[1] = (long *)local_58[1];
          *local_58 = (long **)local_58;
          local_58[1] = (long **)local_58;
          (*(code *)local_58[-1])(loop,local_58 + -1,4);
        }
      }
      uv__run_idle(loop);
      uv__run_prepare(loop);
      if ((mode == UV_RUN_DEFAULT) ||
         (timeout = 0, mode == UV_RUN_ONCE && (long ****)ppvVar8 == pppplVar3)) {
        timeout = uv_backend_timeout(loop);
      }
      uv__io_poll(loop,timeout);
      uv__run_check(loop);
      puVar5 = (uv_stream_t *)loop->closing_handles;
      loop->closing_handles = (uv_handle_t *)0x0;
      ppvVar8 = local_38;
      while (stream = puVar5, local_38 = ppvVar8, stream != (uv_stream_t *)0x0) {
        uVar6 = stream->flags;
        if ((uVar6 & 1) == 0) {
          __assert_fail("handle->flags & UV_CLOSING",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                        ,0xf1,"void uv__finish_close(uv_handle_t *)");
        }
        if ((uVar6 & 2) != 0) {
          __assert_fail("!(handle->flags & UV_CLOSED)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                        ,0xf2,"void uv__finish_close(uv_handle_t *)");
        }
        puVar5 = (uv_stream_t *)stream->next_closing;
        stream->flags = uVar6 | 2;
        uVar2 = stream->type;
        if (UV_SIGNAL < uVar2) {
LAB_00540906:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                        ,0x10d,"void uv__finish_close(uv_handle_t *)");
        }
        if ((0x1275eU >> (uVar2 & (UV_SIGNAL|UV_UDP)) & 1) == 0) {
          if ((0x5080U >> (uVar2 & (UV_SIGNAL|UV_UDP)) & 1) == 0) {
            if (uVar2 != UV_UDP) goto LAB_00540906;
            uv__udp_finish_close((uv_udp_t *)stream);
          }
          else {
            uv__stream_destroy(stream);
          }
        }
        uVar6 = stream->flags;
        if (((uVar6 >> 0xd & 1) != 0) &&
           (stream->flags = uVar6 & 0xffffdfff, (uVar6 >> 0xe & 1) != 0)) {
          puVar1 = &stream->loop->active_handles;
          *puVar1 = *puVar1 - 1;
        }
        *(void **)stream->handle_queue[1] = stream->handle_queue[0];
        *(void **)((long)stream->handle_queue[0] + 8) = stream->handle_queue[1];
        ppvVar8 = local_38;
        if (stream->close_cb != (uv_close_cb)0x0) {
          (*stream->close_cb)((uv_handle_t *)stream);
          ppvVar8 = local_38;
        }
      }
      if (mode == UV_RUN_ONCE) {
        uVar7 = uv__hrtime(UV_CLOCK_FAST);
        loop->time = uVar7 / 1000000;
        uv__run_timers(loop);
      }
      uVar6 = 1;
      if ((loop->active_handles == 0) && (local_40 == (void **)*local_40)) {
        uVar6 = (uint)(loop->closing_handles != (uv_handle_t *)0x0);
      }
      if ((0xfffffffd < mode + ~UV_RUN_NOWAIT) || (uVar6 == 0)) goto LAB_00540886;
    }
    uVar6 = 1;
  }
LAB_00540886:
  if (loop->stop_flag != 0) {
    loop->stop_flag = 0;
  }
  return uVar6;
}

Assistant:

int uv_run(uv_loop_t* loop, uv_run_mode mode) {
  int timeout;
  int r;
  int ran_pending;

  r = uv__loop_alive(loop);
  if (!r)
    uv__update_time(loop);

  while (r != 0 && loop->stop_flag == 0) {
    uv__update_time(loop);
    uv__run_timers(loop);
    ran_pending = uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);

    timeout = 0;
    if ((mode == UV_RUN_ONCE && !ran_pending) || mode == UV_RUN_DEFAULT)
      timeout = uv_backend_timeout(loop);

    uv__io_poll(loop, timeout);
    uv__run_check(loop);
    uv__run_closing_handles(loop);

    if (mode == UV_RUN_ONCE) {
      /* UV_RUN_ONCE implies forward progress: at least one callback must have
       * been invoked when it returns. uv__io_poll() can return without doing
       * I/O (meaning: no callbacks) when its timeout expires - which means we
       * have pending timers that satisfy the forward progress constraint.
       *
       * UV_RUN_NOWAIT makes no guarantees about progress so it's omitted from
       * the check.
       */
      uv__update_time(loop);
      uv__run_timers(loop);
    }

    r = uv__loop_alive(loop);
    if (mode == UV_RUN_ONCE || mode == UV_RUN_NOWAIT)
      break;
  }

  /* The if statement lets gcc compile it to a conditional store. Avoids
   * dirtying a cache line.
   */
  if (loop->stop_flag != 0)
    loop->stop_flag = 0;

  return r;
}